

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

Reduction * add_Reduction(Parser *p,ZNode *z,SNode *sn,D_Reduction *reduction)

{
  uint uVar1;
  uint uVar2;
  Reduction *local_50;
  Reduction *r;
  uint dd;
  uint d;
  Reduction **l;
  Reduction *x;
  D_Reduction *reduction_local;
  SNode *sn_local;
  ZNode *z_local;
  Parser *p_local;
  
  _dd = &p->reductions_todo;
  uVar1 = znode_depth(z);
  l = (Reduction **)p->reductions_todo;
  while( true ) {
    if ((l == (Reduction **)0x0) || ((ZNode *)(sn->loc).s < l[1]->znode)) goto LAB_00156428;
    uVar2 = znode_depth((ZNode *)*l);
    if (((ZNode *)(sn->loc).s == l[1]->znode) && (uVar2 <= uVar1)) break;
    _dd = l + 5;
    l = (Reduction **)l[5];
  }
  if (uVar1 == uVar2) {
    for (; l != (Reduction **)0x0; l = (Reduction **)l[5]) {
      if (((sn == (SNode *)l[1]) && ((Reduction *)z == *l)) && (reduction == (D_Reduction *)l[2])) {
        return (Reduction *)0x0;
      }
    }
  }
LAB_00156428:
  local_50 = p->free_reductions;
  if (local_50 == (Reduction *)0x0) {
    local_50 = (Reduction *)malloc(0x30);
  }
  else {
    p->free_reductions = local_50->next;
  }
  local_50->znode = z;
  local_50->snode = sn;
  local_50->new_snode = (SNode *)0x0;
  sn->refcount = sn->refcount + 1;
  local_50->reduction = reduction;
  local_50->next = *_dd;
  *_dd = local_50;
  return local_50;
}

Assistant:

static Reduction *add_Reduction(Parser *p, ZNode *z, SNode *sn, D_Reduction *reduction) {
  Reduction *x, **l = &p->reductions_todo;
  uint d = znode_depth(z), dd;
  for (x = p->reductions_todo; x; l = &x->next, x = x->next) {
    if (sn->loc.s < x->snode->loc.s) break;
    dd = znode_depth(x->znode);
    if ((sn->loc.s == x->snode->loc.s && d >= dd)) {
      if (d == dd)
        while (x) {
          if (sn == x->snode && z == x->znode && reduction == x->reduction) return NULL;
          x = x->next;
        }
      break;
    }
  }
  {
    Reduction *r = p->free_reductions;
    if (!r)
      r = MALLOC(sizeof *r);
    else
      p->free_reductions = r->next;
    r->znode = z;
    r->snode = sn;
    r->new_snode = NULL;
    ref_sn(sn);
    r->reduction = reduction;
    r->next = *l;
    *l = r;
    return r;
  }
}